

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::TryGenerateFastCmSrXx(Lowerer *this,Instr *instr)

{
  bool bVar1;
  Opnd *pOVar2;
  RegOpnd *local_48;
  RegOpnd *local_40;
  RegOpnd *srcReg2;
  RegOpnd *srcReg1;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar2 = IR::Instr::GetSrc1(instr);
  bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
  if (bVar1) {
    pOVar2 = IR::Instr::GetSrc1(instr);
    local_40 = IR::Opnd::AsRegOpnd(pOVar2);
  }
  else {
    local_40 = (RegOpnd *)0x0;
  }
  pOVar2 = IR::Instr::GetSrc2(instr);
  bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
  if (bVar1) {
    pOVar2 = IR::Instr::GetSrc2(instr);
    local_48 = IR::Opnd::AsRegOpnd(pOVar2);
  }
  else {
    local_48 = (RegOpnd *)0x0;
  }
  if ((local_48 == (RegOpnd *)0x0) || (bVar1 = IsConstRegOpnd(this,local_48), !bVar1)) {
    if ((local_40 == (RegOpnd *)0x0) || (bVar1 = IsConstRegOpnd(this,local_40), !bVar1)) {
      this_local._7_1_ = false;
    }
    else {
      IR::Instr::SwapOpnds(instr);
      this_local._7_1_ = LowererMD::GenerateFastCmSrXxConst(&this->m_lowererMD,instr);
    }
  }
  else {
    this_local._7_1_ = LowererMD::GenerateFastCmSrXxConst(&this->m_lowererMD,instr);
  }
  return this_local._7_1_;
}

Assistant:

bool
Lowerer::TryGenerateFastCmSrXx(IR::Instr * instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    if (srcReg2 && IsConstRegOpnd(srcReg2))
    {
        return m_lowererMD.GenerateFastCmSrXxConst(instr);
    }
    else if (srcReg1 && IsConstRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        return m_lowererMD.GenerateFastCmSrXxConst(instr);
    }

    return false;
}